

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

void Zyx_ManFree(Zyx_Man_t *p)

{
  Vec_Wrd_t *__ptr;
  int *piVar1;
  Vec_Int_t *pVVar2;
  
  bmcg_sat_solver_stop(p->pSat);
  __ptr = p->vInfo;
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  if (__ptr != (Vec_Wrd_t *)0x0) {
    free(__ptr);
  }
  if (p->vUsed2 != (Vec_Bit_t *)0x0) {
    piVar1 = p->vUsed2->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vUsed2->pArray = (int *)0x0;
    }
    if (p->vUsed2 != (Vec_Bit_t *)0x0) {
      free(p->vUsed2);
      p->vUsed2 = (Vec_Bit_t *)0x0;
    }
  }
  if (p->vUsed3 != (Vec_Bit_t *)0x0) {
    piVar1 = p->vUsed3->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vUsed3->pArray = (int *)0x0;
    }
    if (p->vUsed3 != (Vec_Bit_t *)0x0) {
      free(p->vUsed3);
      p->vUsed3 = (Vec_Bit_t *)0x0;
    }
  }
  pVVar2 = p->vPairs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vMidMints;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vVarValues;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  if (p != (Zyx_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Zyx_ManFree( Zyx_Man_t * p )
{
    bmcg_sat_solver_stop( p->pSat );
    Vec_WrdFree( p->vInfo );
    Vec_BitFreeP( &p->vUsed2 );
    Vec_BitFreeP( &p->vUsed3 );
    Vec_IntFree( p->vPairs );
    Vec_IntFree( p->vMidMints );
    Vec_IntFree( p->vVarValues );
    ABC_FREE( p );
}